

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O3

void COST_SENSITIVE::name_value(substring *s,v_array<substring> *name,float *v)

{
  vw_exception *this;
  ulong uVar1;
  anon_union_4_2_947300a4 x;
  float fVar2;
  stringstream __msg;
  string sStack_1c8;
  stringstream local_1a8 [16];
  ostream local_198;
  
  tokenize<v_array<substring>>(':',*s,name,false);
  uVar1 = (long)name->_end - (long)name->_begin >> 4;
  if (uVar1 < 2) {
    *v = 1.0;
  }
  else {
    if (uVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"example with a wierd name.  What is \'",0x25);
      std::ostream::write((char *)&std::cerr,(long)s->begin);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'?\n",3);
      return;
    }
    fVar2 = float_of_substring(name->_begin[1]);
    *v = fVar2;
    if ((~(uint)fVar2 & 0x7fc00000) == 0) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(&local_198,"error NaN value for: ",0x15);
      ::operator<<(&local_198,name->_begin);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cost_sensitive.cc"
                 ,0x16,&sStack_1c8);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  }
  return;
}

Assistant:

void name_value(substring& s, v_array<substring>& name, float& v)
{
  tokenize(':', s, name);

  switch (name.size())
  {
    case 0:
    case 1:
      v = 1.;
      break;
    case 2:
      v = float_of_substring(name[1]);
      if (nanpattern(v))
        THROW("error NaN value for: " << name[0]);
      break;
    default:
      cerr << "example with a wierd name.  What is '";
      cerr.write(s.begin, s.end - s.begin);
      cerr << "'?\n";
  }
}